

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

EnumValueDescriptor * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetEnum
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  int iVar1;
  LogMessage *pLVar2;
  EnumValueDescriptor *pEVar3;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnum","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnum",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 8) {
    anon_unknown_0::ReportReflectionUsageTypeError(this->descriptor_,field,"GetEnum",CPPTYPE_ENUM);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    iVar1 = this->extensions_offset_;
    if (iVar1 == -1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4ae);
      pLVar2 = LogMessage::operator<<(&local_60,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_61,pLVar2);
      LogMessage::~LogMessage(&local_60);
      iVar1 = this->extensions_offset_;
    }
    iVar1 = ExtensionSet::GetEnum
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar1),
                       *(int *)(field + 0x28),*(int *)(*(long *)(field + 0x70) + 0x10));
  }
  else {
    iVar1 = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                    (long)this->offsets_
                          [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >>
                                3) * -0x11111111]);
  }
  pEVar3 = EnumDescriptor::FindValueByNumber(*(EnumDescriptor **)(field + 0x50),iVar1);
  if (pEVar3 == (EnumValueDescriptor *)0x0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
               ,0x38d);
    pLVar2 = LogMessage::operator<<(&local_60,"CHECK failed: result != NULL: ");
    pLVar2 = LogMessage::operator<<(pLVar2,"Value ");
    pLVar2 = LogMessage::operator<<(pLVar2,iVar1);
    pLVar2 = LogMessage::operator<<(pLVar2," is not valid for field ");
    pLVar2 = LogMessage::operator<<(pLVar2,*(string **)(field + 8));
    pLVar2 = LogMessage::operator<<(pLVar2," of type ");
    pLVar2 = LogMessage::operator<<(pLVar2,*(string **)(*(long *)(field + 0x50) + 8));
    pLVar2 = LogMessage::operator<<(pLVar2,".");
    LogFinisher::operator=(&local_61,pLVar2);
    LogMessage::~LogMessage(&local_60);
  }
  return pEVar3;
}

Assistant:

const EnumValueDescriptor* GeneratedMessageReflection::GetEnum(
    const Message& message, const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetEnum, SINGULAR, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetEnum(
      field->number(), field->default_value_enum()->number());
  } else {
    value = GetField<int>(message, field);
  }
  const EnumValueDescriptor* result =
    field->enum_type()->FindValueByNumber(value);
  GOOGLE_CHECK(result != NULL) << "Value " << value << " is not valid for field "
                        << field->full_name() << " of type "
                        << field->enum_type()->full_name() << ".";
  return result;
}